

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadlist.cpp
# Opt level: O0

int __thiscall Quadlist::clear(Quadlist *this)

{
  Entry local_40;
  int local_14;
  Quadlist *pQStack_10;
  int old_size;
  Quadlist *this_local;
  
  local_14 = this->_size;
  pQStack_10 = this;
  while (0 < this->_size) {
    remove((Quadlist *)&local_40,(char *)this);
    Entry::~Entry(&local_40);
  }
  return local_14;
}

Assistant:

int Quadlist::clear() {
    int old_size =_size;
    while (0<_size) remove(header->succ);
    return old_size;
}